

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::_InternalParse
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *p;
  uint uVar4;
  pair<const_char_*,_unsigned_int> pVar5;
  pair<const_char_*,_unsigned_long> pVar6;
  double *local_30;
  
  local_30 = (double *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_30;
      uVar4 = (uint)bVar1;
      p = (double *)((long)local_30 + 1);
      if ((char)bVar1 < '\0') {
        uVar4 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar5 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar4);
          p = (double *)pVar5.first;
          uVar4 = pVar5.second;
        }
        else {
          p = (double *)((long)local_30 + 2);
        }
      }
      local_30 = p;
      if (uVar4 >> 3 == 2) {
        if ((char)uVar4 != '\x11') goto LAB_002c595e;
        this->evaluationvalue_ = *p;
        local_30 = p + 1;
      }
      else if ((uVar4 >> 3 == 1) && ((char)uVar4 == '\b')) {
        uVar3 = (ulong)(char)*(byte *)p;
        local_30 = (double *)((long)p + 1);
        if ((long)uVar3 < 0) {
          uVar4 = ((uint)*(byte *)local_30 * 0x80 + (uint)*(byte *)p) - 0x80;
          if ((char)*(byte *)local_30 < '\0') {
            local_30 = p;
            pVar6 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar4);
            local_30 = (double *)pVar6.first;
            this->evaluationindex_ = pVar6.second;
            goto LAB_002c5992;
          }
          uVar3 = (ulong)uVar4;
          local_30 = (double *)((long)p + 2);
        }
        this->evaluationindex_ = uVar3;
      }
      else {
LAB_002c595e:
        if ((uVar4 == 0) || ((uVar4 & 7) == 4)) {
          if (p == (double *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar4 - 1;
          return (char *)p;
        }
        uVar3 = this_00->ptr_;
        if ((uVar3 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar3 & 0xfffffffffffffffc) + 8);
        }
        local_30 = (double *)
                   google::protobuf::internal::UnknownFieldParse(uVar4,unknown,(char *)local_30,ctx)
        ;
LAB_002c5992:
        if (local_30 == (double *)0x0) {
          return (char *)0x0;
        }
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* TreeEnsembleParameters_TreeNode_EvaluationInfo::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 evaluationIndex = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          evaluationindex_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double evaluationValue = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 17)) {
          evaluationvalue_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}